

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghbn(fitsfile *fptr,int maxfield,long *naxis2,int *tfields,char **ttype,char **tform,
          char **tunit,char *extnm,long *pcount,int *status)

{
  undefined4 uVar1;
  int iVar2;
  int *in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  undefined1 *in_stack_00000010;
  LONGLONG pcountll;
  LONGLONG naxis2ll;
  LONGLONG naxis1ll;
  char message [81];
  char xtension [71];
  char comm [73];
  char value [71];
  char name [75];
  long fields;
  int tstatus;
  int nfound;
  int maxf;
  int ii;
  long *in_stack_fffffffffffffdd8;
  LONGLONG *in_stack_fffffffffffffde0;
  LONGLONG *in_stack_fffffffffffffde8;
  LONGLONG *in_stack_fffffffffffffdf0;
  fitsfile *in_stack_fffffffffffffdf8;
  char local_1f8 [16];
  int *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  fitsfile *in_stack_fffffffffffffe38;
  char local_198 [56];
  int *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  fitsfile *in_stack_fffffffffffffec8;
  char local_f8 [80];
  int *in_stack_ffffffffffffff58;
  char **in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff90;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_4;
  
  if (*(int *)naxis2ll < 1) {
    ffgkyn(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
           in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    iVar2 = strcmp(&stack0xffffffffffffff58,"XTENSION");
    if (iVar2 == 0) {
      iVar2 = ffc2s((char *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0,
                    (int *)in_stack_fffffffffffffde8);
      if (iVar2 < 1) {
        if ((local_f8[0] == '\'') &&
           (((iVar2 = strcmp(local_198,"BINTABLE"), iVar2 == 0 ||
             (iVar2 = strcmp(local_198,"A3DTABLE"), iVar2 == 0)) ||
            (iVar2 = strcmp(local_198,"3DTABLE"), iVar2 == 0)))) {
          iVar2 = ffgttb(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                         in_stack_fffffffffffffdd8,(int *)0x1d34ff);
          if (iVar2 < 1) {
            if (in_RDX != (undefined8 *)0x0) {
              *in_RDX = in_stack_fffffffffffffdf8;
            }
            if (pcountll != 0) {
              *(LONGLONG **)pcountll = in_stack_fffffffffffffdf0;
            }
            local_40 = (int)local_50;
            if (in_RCX != (int *)0x0) {
              *in_RCX = local_40;
            }
            if (-1 < in_ESI) {
              if (in_ESI < local_50) {
                local_50 = (long)in_ESI;
              }
              local_40 = (int)local_50;
            }
            if (0 < local_40) {
              for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
                if (in_R8 != 0) {
                  **(undefined1 **)(in_R8 + (long)local_3c * 8) = 0;
                }
                if (in_stack_00000008 != 0) {
                  **(undefined1 **)(in_stack_00000008 + (long)local_3c * 8) = 0;
                }
              }
              if (in_R8 != 0) {
                ffgkns(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c
                       ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff90);
              }
              if (in_stack_00000008 != 0) {
                ffgkns(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c
                       ,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff90);
              }
              if (0 < *(int *)naxis2ll) {
                return *(int *)naxis2ll;
              }
              if ((in_R9 != 0) &&
                 ((ffgkns(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff90), 0 < *(int *)naxis2ll || (local_44 != local_40)
                  ))) {
                ffpmsg((char *)0x1d376b);
                *(undefined4 *)naxis2ll = 0xe8;
                return 0xe8;
              }
            }
            if (in_stack_00000010 != (undefined1 *)0x0) {
              *in_stack_00000010 = 0;
              uVar1 = *(undefined4 *)naxis2ll;
              ffgkys(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              if (*(int *)naxis2ll == 0xca) {
                *(undefined4 *)naxis2ll = uVar1;
              }
            }
            local_4 = *(int *)naxis2ll;
          }
          else {
            local_4 = *(int *)naxis2ll;
          }
        }
        else {
          snprintf(local_1f8,0x51,"This is not a BINTABLE extension: %s",local_f8);
          ffpmsg((char *)0x1d346b);
          *(undefined4 *)naxis2ll = 0xe3;
          local_4 = 0xe3;
        }
      }
      else {
        ffpmsg((char *)0x1d33c6);
        ffpmsg((char *)0x1d33d3);
        local_4 = *(int *)naxis2ll;
      }
    }
    else {
      snprintf(local_1f8,0x51,"First keyword of the extension is not XTENSION: %s",
               &stack0xffffffffffffff58);
      ffpmsg((char *)0x1d34b5);
      *(undefined4 *)naxis2ll = 0xe1;
      local_4 = 0xe1;
    }
  }
  else {
    local_4 = *(int *)naxis2ll;
  }
  return local_4;
}

Assistant:

int ffghbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxfield,    /* I - maximum no. of columns to read;          */
           long *naxis2,    /* O - number of rows in the table              */
           int *tfields,    /* O - number of columns in the table           */
           char **ttype,    /* O - name of each column                      */
           char **tform,    /* O - TFORMn value for each column             */
           char **tunit,    /* O - TUNITn value for each column             */
           char *extnm,     /* O - value of EXTNAME keyword, if any         */
           long *pcount,    /* O - value of PCOUNT keyword                  */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the BiNary table:
  Check that the keywords conform to the FITS standard and return the
  parameters which describe the table.
*/
{
    int ii, maxf, nfound, tstatus;
    long  fields;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE], message[FLEN_ERRMSG];
    LONGLONG naxis1ll, naxis2ll, pcountll;

    if (*status > 0)
        return(*status);

    /* read the first keyword of the extension */
    ffgkyn(fptr, 1, name, value, comm, status);

    if (!strcmp(name, "XTENSION"))
    {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                 ( strcmp(xtension, "BINTABLE") &&
                   strcmp(xtension, "A3DTABLE") &&
                   strcmp(xtension, "3DTABLE")
                 ) )
            {
                snprintf(message, FLEN_ERRMSG,
                "This is not a BINTABLE extension: %s", value);
                ffpmsg(message);
                return(*status = NOT_BTABLE);
            }
    }

    else  /* error: 1st keyword of extension != XTENSION */
    {
        snprintf(message, FLEN_ERRMSG,
        "First keyword of the extension is not XTENSION: %s", name);
        ffpmsg(message);
        return(*status = NO_XTENSION);
    }

    if (ffgttb(fptr, &naxis1ll, &naxis2ll, &pcountll, &fields, status) > 0)
        return(*status);

    if (naxis2)
       *naxis2 = (long) naxis2ll;

    if (pcount)
       *pcount = (long) pcountll;

    if (tfields)
        *tfields = fields;

    if (maxfield < 0)
        maxf = fields;
    else
        maxf = minvalue(maxfield, fields);

    if (maxf > 0)
    {
        for (ii = 0; ii < maxf; ii++)
        {   /* initialize optional keyword values */
            if (ttype)
                *ttype[ii] = '\0';   

            if (tunit)
                *tunit[ii] = '\0';
        }

        if (ttype)
            ffgkns(fptr, "TTYPE", 1, maxf, ttype, &nfound, status);

        if (tunit)
            ffgkns(fptr, "TUNIT", 1, maxf, tunit, &nfound, status);

        if (*status > 0)
            return(*status);

        if (tform)
        {
            ffgkns(fptr, "TFORM", 1, maxf, tform, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TFORM keyword(s) not found in binary table header (ffghbn).");
                return(*status = NO_TFORM);
            }
        }
    }

    if (extnm)
    {
        extnm[0] = '\0';

        tstatus = *status;
        ffgkys(fptr, "EXTNAME", extnm, comm, status);

        if (*status == KEY_NO_EXIST)
          *status = tstatus;  /* keyword not required, so ignore error */
    }
    return(*status);
}